

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O0

void __thiscall DependentLoop::DependentLoop(DependentLoop *this,size_t numOfViews)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined1 in_stack_ffffffffffffffe7;
  size_type in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  std::
  vector<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
  ::vector((vector<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
            *)0x2ec255);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2ec268);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset(in_RDI);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset(in_RDI);
  std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2ec29f);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_RSI,in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(this_00);
  return;
}

Assistant:

DependentLoop(size_t numOfViews)
    {
        outView.resize(numOfViews + 1);
        outView.reset();
    }